

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

char * name_dot_arc(char *s)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *__s;
  
  __s = "";
  if (s != (char *)0x0) {
    __s = s;
  }
  sVar1 = strlen(__s);
  pcVar3 = __s;
  if (0 < (long)sVar1) {
    pcVar2 = __s + sVar1;
    do {
      if (*pcVar2 == '/') {
        pcVar3 = pcVar2 + 1;
        break;
      }
      pcVar2 = pcVar2 + -1;
    } while (__s < pcVar2);
  }
  sVar1 = strlen(pcVar3);
  if (0xfffffffffffffefe < sVar1 - 0xfd) {
    if (name_dot_arc::newname != (char *)0x0) {
      free(name_dot_arc::newname);
    }
    sVar1 = strlen(__s);
    pcVar3 = (char *)malloc(sVar1 + 5);
    name_dot_arc::newname = pcVar3;
    if (pcVar3 != (char *)0x0) {
      strcpy(pcVar3,__s);
      sVar1 = strlen(pcVar3);
      builtin_strncpy(pcVar3 + sVar1,".arc",5);
      __s = pcVar3;
    }
  }
  return __s;
}

Assistant:

char *
name_dot_arc(char *s)
{
	static char *newname = NULL;

	if (!s)
		s = "";

	/*
	 * check that there's room for the extension
	 */
	if (strlen(basename(s)) + sizeof(DOTARC) - 1 > FILENAMELEN)
		return (s);

	/*
	 * free previous allocation (hope it's finished with :-/)
	 */
	if (newname)
		free(newname);
	newname = malloc(strlen(s) + sizeof(DOTARC));
	if (!newname)
		return (s);				/* don't complain */
	strcpy(newname, s);
	strcat(newname, DOTARC);
	return (newname);
}